

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestGroupUtil.hpp
# Opt level: O0

void vkt::addTestGroup<vkt::wsi::(anonymous_namespace)::GroupParameters>
               (TestCaseGroup *parent,string *name,string *description,
               CreateChildrenFunc createChildren,GroupParameters arg0)

{
  GroupParameters arg0_00;
  TestContext *this;
  TestNode *node;
  undefined8 in_stack_ffffffffffffffa8;
  CreateChildrenFunc createChildren_local;
  string *description_local;
  string *name_local;
  TestCaseGroup *parent_local;
  GroupParameters arg0_local;
  
  this = tcu::TestNode::getTestContext(&parent->super_TestNode);
  arg0_00.function = (Function)parent;
  arg0_00._0_8_ = in_stack_ffffffffffffffa8;
  node = &createTestGroup<vkt::wsi::(anonymous_namespace)::GroupParameters>
                    ((vkt *)this,(TestContext *)name,description,(string *)createChildren,
                     (CreateChildrenFunc)(ulong)arg0.wsiType,arg0_00)->super_TestNode;
  tcu::TestNode::addChild(&parent->super_TestNode,node);
  return;
}

Assistant:

void addTestGroup (tcu::TestCaseGroup*									parent,
				   const std::string&									name,
				   const std::string&									description,
				   typename TestGroupHelper1<Arg0>::CreateChildrenFunc	createChildren,
				   Arg0													arg0)
{
	parent->addChild(createTestGroup<Arg0>(parent->getTestContext(), name, description, createChildren, arg0));
}